

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

boolean munstone(monst *mon,boolean by_you)

{
  int iVar1;
  obj *obj;
  
  if ((((mon->mintrinsics & 0x80) != 0) || (mon->meating != 0)) ||
     ((*(uint *)&mon->field_0x60 & 0xc0000) != 0x40000)) {
    return '\0';
  }
  obj = (obj *)&mon->minvent;
  do {
    while( true ) {
      obj = obj->nobj;
      if (obj == (obj *)0x0) {
        return '\0';
      }
      if (obj->otyp != 0x10e) break;
      iVar1 = obj->corpsenm;
      if (((long)iVar1 == 0x154) || ((iVar1 != 0xd7 && ((mons[iVar1].mflags1 & 0x8000000) != 0))))
      goto LAB_001f1ab6;
    }
  } while (obj->otyp != 0x141);
LAB_001f1ab6:
  mon_consume_unstone(mon,obj,by_you,'\x01');
  return '\x01';
}

Assistant:

boolean munstone(struct monst *mon, boolean by_you)
{
	struct obj *obj;

	if (resists_ston(mon)) return FALSE;
	if (mon->meating || !mon->mcanmove || mon->msleeping) return FALSE;

	for (obj = mon->minvent; obj; obj = obj->nobj) {
	    /* Monsters can also use potions of acid */
	    if ((obj->otyp == POT_ACID) || (obj->otyp == CORPSE &&
	    		(obj->corpsenm == PM_LIZARD || (acidic(&mons[obj->corpsenm]) && obj->corpsenm != PM_GREEN_SLIME)))) {
		mon_consume_unstone(mon, obj, by_you, TRUE);
		return TRUE;
	    }
	}
	return FALSE;
}